

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenTest.cpp
# Opt level: O0

void __thiscall UnitTest1::CodeGenTest::ParserGenTest1(CodeGenTest *this)

{
  char *__stat_loc;
  Grammar<unsigned_char> *__return_storage_ptr__;
  undefined1 local_5d8 [8];
  Stage1Runner runner;
  char *input_path;
  undefined1 local_340 [8];
  ParserEM64T<unsigned_char> parser;
  MyErrorHandler errhandler;
  StringLogger logger;
  Grammar<unsigned_char> grammar;
  CodeGenTest *this_local;
  
  __return_storage_ptr__ = (Grammar<unsigned_char> *)&logger._stringBuilder._canFree;
  LoadGrammar<unsigned_char>(__return_storage_ptr__,"../../grammar/json2.cgr");
  asmjit::StringLogger::StringLogger((StringLogger *)__return_storage_ptr__);
  MyErrorHandler::MyErrorHandler((MyErrorHandler *)&parser.m_func);
  Centaurus::ParserEM64T<unsigned_char>::ParserEM64T
            ((ParserEM64T<unsigned_char> *)local_340,__return_storage_ptr__,(Logger *)&errhandler,
             (ErrorHandler *)&parser.m_func);
  runner.result_chunks_.
  super__Vector_base<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>,_std::allocator<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_1289a3;
  __stat_loc = "../../datasets/citylots.json";
  Centaurus::Stage1Runner::Stage1Runner
            ((Stage1Runner *)local_5d8,"../../datasets/citylots.json",(IParser *)local_340,0x800000,
             8,false,false);
  Centaurus::Stage1Runner::start((Stage1Runner *)local_5d8);
  Centaurus::BaseRunner::wait((BaseRunner *)local_5d8,__stat_loc);
  Centaurus::Stage1Runner::~Stage1Runner((Stage1Runner *)local_5d8);
  Centaurus::ParserEM64T<unsigned_char>::~ParserEM64T((ParserEM64T<unsigned_char> *)local_340);
  MyErrorHandler::~MyErrorHandler((MyErrorHandler *)&parser.m_func);
  asmjit::StringLogger::~StringLogger((StringLogger *)__return_storage_ptr__);
  Centaurus::Grammar<unsigned_char>::~Grammar
            ((Grammar<unsigned_char> *)&logger._stringBuilder._canFree);
  return;
}

Assistant:

TEST_METHOD(ParserGenTest1)
    {
        using namespace Centaurus;

        Grammar<unsigned char> grammar = LoadGrammar<unsigned char>("../../grammar/json2.cgr");

        asmjit::StringLogger logger;

        MyErrorHandler errhandler;

        ParserEM64T<unsigned char> parser(grammar, &logger, &errhandler);

#if defined(CENTAURUS_BUILD_WINDOWS)
		const char *input_path = "..\\..\\datasets\\citylots.json";
#elif defined(CENTAURUS_BUILD_LINUX)
        const char *input_path = "../../datasets/citylots.json";
#endif

        Stage1Runner runner{input_path, &parser, 8 * 1024 * 1024, 8};

		runner.start();
        runner.wait();

        //Assert::AreEqual((const void *)(json + strlen(json)), context.result);
        //Assert::IsTrue(runner.get_result() != NULL);

        //_aligned_free(json);
    }